

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr TIFFReadDirEntrySshortArray(TIFF *tif,TIFFDirEntry *direntry,int16_t **value)

{
  uint16_t uVar1;
  uint uVar2;
  ulong uVar3;
  TIFFReadDirEntryErr TVar4;
  int16_t *piVar5;
  short sVar6;
  int64_t *ma;
  uint64_t *puVar7;
  uint32_t *puVar8;
  ulong uVar9;
  uint16_t *wp;
  long lVar10;
  bool bVar11;
  uint32_t count;
  int16_t *local_48;
  ulong local_40;
  void *origdata;
  
  if (0x11 < direntry->tdir_type) {
    return TIFFReadDirEntryErrType;
  }
  if ((0x3035aU >> (direntry->tdir_type & 0x1f) & 1) == 0) {
    return TIFFReadDirEntryErrType;
  }
  TVar4 = TIFFReadDirEntryArray(tif,direntry,&count,2,&origdata);
  if (origdata == (void *)0x0 || TVar4 != TIFFReadDirEntryErrOk) {
    *value = (int16_t *)0x0;
    return TVar4;
  }
  if (direntry->tdir_type == 8) {
    *value = (int16_t *)origdata;
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabArrayOfShort((uint16_t *)origdata,(ulong)count);
      return TIFFReadDirEntryErrOk;
    }
    return TIFFReadDirEntryErrOk;
  }
  wp = (uint16_t *)origdata;
  if (direntry->tdir_type == 3) {
    while( true ) {
      if (count == 0) {
        *value = (int16_t *)origdata;
        return TIFFReadDirEntryErrOk;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(wp);
      }
      TVar4 = *wp >> 0xd & TIFFReadDirEntryErrRange;
      if ((*wp >> 0xd & 4) != 0) break;
      wp = wp + 1;
      count = count - 1;
    }
    goto LAB_002536c5;
  }
  local_40 = (ulong)count;
  piVar5 = (int16_t *)_TIFFmallocExt(tif,(ulong)(count * 2));
  if (piVar5 == (int16_t *)0x0) {
    _TIFFfreeExt(tif,origdata);
    return TIFFReadDirEntryErrAlloc;
  }
  uVar1 = direntry->tdir_type;
  TVar4 = TIFFReadDirEntryErrOk;
  bVar11 = true;
  local_48 = piVar5;
  switch(uVar1) {
  case 1:
    TVar4 = TIFFReadDirEntryErrOk;
    for (lVar10 = 0; (int)local_40 != (int)lVar10; lVar10 = lVar10 + 1) {
      piVar5[lVar10] = (ushort)*(byte *)((long)origdata + lVar10);
    }
    break;
  case 2:
  case 3:
  case 5:
  case 7:
  case 8:
    break;
  case 4:
    TVar4 = TIFFReadDirEntryErrOk;
    puVar8 = (uint32_t *)origdata;
    uVar9 = local_40;
    for (lVar10 = 0; bVar11 = (int)uVar9 == (int)lVar10, !bVar11; lVar10 = lVar10 + 1) {
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong(puVar8);
        piVar5 = local_48;
        uVar9 = local_40;
      }
      uVar2 = *puVar8;
      if (0x7fff < uVar2) goto LAB_00253696;
      puVar8 = puVar8 + 1;
      piVar5[lVar10] = (int16_t)uVar2;
    }
    break;
  case 6:
    TVar4 = TIFFReadDirEntryErrOk;
    for (lVar10 = 0; (int)local_40 != (int)lVar10; lVar10 = lVar10 + 1) {
      piVar5[lVar10] = (short)*(char *)((long)origdata + lVar10);
    }
    break;
  case 9:
    TVar4 = TIFFReadDirEntryErrOk;
    puVar8 = (uint32_t *)origdata;
    uVar9 = local_40;
    for (lVar10 = 0; bVar11 = (int)uVar9 == (int)lVar10, !bVar11; lVar10 = lVar10 + 1) {
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong(puVar8);
        piVar5 = local_48;
        uVar9 = local_40;
      }
      sVar6 = (short)*puVar8;
      if ((int)sVar6 != *puVar8) goto LAB_00253696;
      puVar8 = puVar8 + 1;
      piVar5[lVar10] = sVar6;
    }
    break;
  default:
    if (uVar1 == 0x10) {
      TVar4 = TIFFReadDirEntryErrOk;
      puVar7 = (uint64_t *)origdata;
      uVar9 = local_40;
      for (lVar10 = 0; bVar11 = (int)uVar9 == (int)lVar10, !bVar11; lVar10 = lVar10 + 1) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(puVar7);
          piVar5 = local_48;
          uVar9 = local_40;
        }
        uVar3 = *puVar7;
        if (0x7fff < uVar3) goto LAB_00253696;
        puVar7 = puVar7 + 1;
        piVar5[lVar10] = (int16_t)uVar3;
      }
    }
    else if (uVar1 == 0x11) {
      TVar4 = TIFFReadDirEntryErrOk;
      puVar7 = (uint64_t *)origdata;
      uVar9 = local_40;
      for (lVar10 = 0; bVar11 = (int)uVar9 == (int)lVar10, !bVar11; lVar10 = lVar10 + 1) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(puVar7);
          piVar5 = local_48;
          uVar9 = local_40;
        }
        sVar6 = (short)*puVar7;
        if ((long)sVar6 != *puVar7) goto LAB_00253696;
        puVar7 = puVar7 + 1;
        piVar5[lVar10] = sVar6;
      }
    }
  }
switchD_002534f1_caseD_2:
  _TIFFfreeExt(tif,origdata);
  origdata = local_48;
  if (bVar11) {
    *value = local_48;
    return TIFFReadDirEntryErrOk;
  }
LAB_002536c5:
  _TIFFfreeExt(tif,origdata);
  return TVar4;
LAB_00253696:
  TVar4 = TIFFReadDirEntryErrRange;
  goto switchD_002534f1_caseD_2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshortArray(TIFF *tif, TIFFDirEntry *direntry, int16_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    int16_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 2, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_SHORT:
        {
            uint16_t *m;
            uint32_t n;
            m = (uint16_t *)origdata;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(m);
                err = TIFFReadDirEntryCheckRangeSshortShort(*m);
                if (err != TIFFReadDirEntryErrOk)
                {
                    _TIFFfreeExt(tif, origdata);
                    return (err);
                }
                m++;
            }
            *value = (int16_t *)origdata;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            *value = (int16_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfShort((uint16_t *)(*value), count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (int16_t *)_TIFFmallocExt(tif, count * 2);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    if (err != TIFFReadDirEntryErrOk)
    {
        _TIFFfreeExt(tif, data);
        return (err);
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}